

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void handle_token(string *v,size_t s,size_t l,list<SToken,_std::allocator<SToken>_> *tokens)

{
  int iVar1;
  char *local_60;
  string t;
  
  if (l != 0) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)v);
    iVar1 = strcasecmp("true",local_60);
    if ((iVar1 == 0) || (iVar1 = strcasecmp("false",local_60), iVar1 == 0)) {
      t.field_2._8_4_ = 3;
      std::__cxx11::list<SToken,_std::allocator<SToken>_>::push_back
                (tokens,(value_type *)((long)&t.field_2 + 8));
    }
    else if (*local_60 == '\'') {
      t.field_2._8_4_ = 5;
      std::__cxx11::list<SToken,_std::allocator<SToken>_>::push_back
                (tokens,(value_type *)((long)&t.field_2 + 8));
    }
    else {
      t.field_2._8_4_ = 4;
      std::__cxx11::list<SToken,_std::allocator<SToken>_>::push_back
                (tokens,(value_type *)((long)&t.field_2 + 8));
    }
    std::__cxx11::string::~string((string *)&local_60);
    return;
  }
  return;
}

Assistant:

void handle_token(const std::string& v, size_t s, size_t l, std::list<SToken>& tokens)
{
    if (0 == l)
    {
        return;
    }
    
    std::string t = v.substr(s, l);
    if (0 == strcasecmp("true", t.c_str())
        || 0 == strcasecmp("false", t.c_str()))
    {
        tokens.push_back(SToken(BOOLEAN, s, l));
    }
    else if ('\'' == t[0])
    {
        tokens.push_back(SToken(STRING, s, l));
    }
    else
    {
        tokens.push_back(SToken(NUMBER, s, l));
    }
}